

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZHelp.cpp
# Opt level: O0

string * CZHelp::trim_copy(string *s)

{
  string *in_RSI;
  string *in_RDI;
  
  trim((string *)0x1cb03c);
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string CZHelp::trim_copy(std::string s) {
    trim(s);
    return s;
}